

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mymock.hpp
# Opt level: O1

void __thiscall MyMock::MyMock(MyMock *this)

{
  anon_class_8_1_8991fb9c local_18;
  
  (this->super_mock_impl)._methods._M_h._M_buckets =
       &(this->super_mock_impl)._methods._M_h._M_single_bucket;
  (this->super_mock_impl)._methods._M_h._M_bucket_count = 1;
  (this->super_mock_impl)._methods._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_mock_impl)._methods._M_h._M_element_count = 0;
  (this->super_mock_impl)._methods._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_mock_impl)._methods._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_mock_impl)._methods._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_mock_impl)._vptr_mock_impl = (_func_int **)&PTR__mock_impl_00109be0;
  this->z = 0;
  local_18.this = this;
  mockaron::detail::mock_impl::add_hook<int(int),int,MyMock::MyMock()::_lambda((auto:1&&)___)_1_>
            (&this->super_mock_impl,"f",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::
  add_hook<int(int_const&),int,MyMock::MyMock()::_lambda((auto:1&&)___)_2_>
            (&this->super_mock_impl,"g",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::
  add_hook<float(float),float,MyMock::MyMock()::_lambda((auto:1&&)___)_3_>
            (&this->super_mock_impl,"g",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::
  add_hook<int(int)const,int,MyMock::MyMock()::_lambda((auto:1&&)___)_4_>
            (&this->super_mock_impl,"h",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::add_hook<int(),int,MyMock::MyMock()::_lambda((auto:1&&)___)_5_>
            (&this->super_mock_impl,"i",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::add_hook<void(),void,MyMock::MyMock()::_lambda((auto:1&&)___)_6_>
            (&this->super_mock_impl,"j",&local_18);
  local_18.this = this;
  mockaron::detail::mock_impl::
  add_hook<My::NoCopy&(),My::NoCopy&,MyMock::MyMock()::_lambda((auto:1&&)___)_7_>
            (&this->super_mock_impl,"k",&local_18);
  return;
}

Assistant:

MyMock()
  {
    MOCKARON_DECLARE_IMPL(My, f);
    MOCKARON_DECLARE_IMPL_SIG(int(int const&), My, g);
    MOCKARON_DECLARE_IMPL_SIG(float(float), My, g);
    MOCKARON_DECLARE_IMPL(My, h);
    MOCKARON_DECLARE_IMPL(My, i);
    MOCKARON_DECLARE_IMPL(My, j);
    MOCKARON_DECLARE_IMPL(My, k);
  }